

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall pass_non_synthesizable_Test::TestBody(pass_non_synthesizable_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  Generator *pGVar2;
  FunctionCallVar *pFVar3;
  StmtBlock *this_01;
  element_type *peVar4;
  char *message;
  pair<const_char_*,_int> pVar5;
  AssertHelper local_2e0;
  Message local_2d8 [2];
  UserException *anon_var_0;
  type e;
  undefined1 auStack_298 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  int local_25c;
  pair<const_char_*,_int> local_258;
  shared_ptr<kratos::Stmt> local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  shared_ptr<kratos::FunctionCallStmt> stmt;
  allocator<char> local_1e1;
  string local_1e0;
  FunctionCallVar *local_1c0;
  FunctionCallVar *call;
  string local_1b0 [32];
  undefined1 local_190 [8];
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context c;
  pass_non_synthesizable_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  kratos::Generator::combinational
            ((Generator *)
             &dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"test_dpi",(allocator<char> *)((long)&call + 7));
  kratos::Generator::dpi_function((Generator *)local_190,(string *)pGVar2);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&call + 7));
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"test_dpi",&local_1e1);
  stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         *)this_00);
  pFVar3 = kratos::Generator::call
                     (pGVar2,&local_1e0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                       *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *)&stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  local_1c0 = pFVar3;
  kratos::Var::as<kratos::FunctionCallVar>((Var *)local_238);
  std::make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionCallVar>>
            ((shared_ptr<kratos::FunctionCallVar> *)local_228);
  std::shared_ptr<kratos::FunctionCallVar>::~shared_ptr
            ((shared_ptr<kratos::FunctionCallVar> *)local_238);
  this_01 = &std::
             __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&dpi.
                              super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount)->super_StmtBlock;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
            (&local_248,(shared_ptr<kratos::FunctionCallStmt> *)local_228);
  kratos::StmtBlock::add_stmt(this_01,&local_248);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_248);
  peVar4 = std::
           __shared_ptr_access<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_228);
  local_25c = 0x23;
  pVar5 = std::make_pair<char_const(&)[88],int>
                    ((char (*) [88])
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
                     ,&local_25c);
  local_258.first = pVar5.first;
  local_258.second = pVar5.second;
  std::
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  ::emplace_back<std::pair<char_const*,int>>
            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              *)&(peVar4->super_Stmt).super_IRNode.fn_name_ln,&local_258);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_298[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffd69 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_298);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_298);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::check_non_synthesizable_content(local_138);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_00139708;
    std::__cxx11::string::operator=
              ((string *)auStack_298,
               "Expected: check_non_synthesizable_content(&mod) throws an exception of type UserException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_2d8);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_2e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x26,message);
  testing::internal::AssertHelper::operator=(&local_2e0,local_2d8);
  testing::internal::AssertHelper::~AssertHelper(&local_2e0);
  testing::Message::~Message(local_2d8);
LAB_00139708:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_298);
  std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr
            ((shared_ptr<kratos::FunctionCallStmt> *)local_228);
  std::shared_ptr<kratos::DPIFunctionStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::DPIFunctionStmtBlock> *)local_190);
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)
             &dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, non_synthesizable) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto comb = mod.combinational();
    auto dpi = mod.dpi_function("test_dpi");
    auto &call = mod.call("test_dpi", std::map<std::string, std::shared_ptr<Var>>{});
    auto stmt = std::make_shared<FunctionCallStmt>(call.as<FunctionCallVar>());
    comb->add_stmt(stmt);
    // add debug info
    stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // run the pass
    EXPECT_THROW(check_non_synthesizable_content(&mod), UserException);
}